

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interner.h
# Opt level: O3

void SymbolInterner::Initialize(void)

{
  SymbolInterner *pSVar1;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (g_the_interner == (SymbolInterner *)0x0) {
    pSVar1 = (SymbolInterner *)operator_new(0x50);
    (pSVar1->map)._M_h._M_buckets = &(pSVar1->map)._M_h._M_single_bucket;
    (pSVar1->map)._M_h._M_bucket_count = 1;
    (pSVar1->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pSVar1->map)._M_h._M_element_count = 0;
    (pSVar1->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pSVar1->map)._M_h._M_rehash_policy._M_next_resize = 0;
    (pSVar1->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (pSVar1->vec).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar1->vec).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar1->vec).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    g_the_interner = pSVar1;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"quote","");
    Intern(pSVar1,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"define","");
    Intern(pSVar1,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"set!","");
    Intern(pSVar1,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"lambda","");
    Intern(pSVar1,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"if","");
    Intern(pSVar1,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"begin","");
    Intern(pSVar1,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"unquote","");
    Intern(pSVar1,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"unquote-splicing","");
    Intern(pSVar1,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"quasiquote","");
    Intern(pSVar1,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"append","");
    Intern(pSVar1,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"defmacro","");
    Intern(pSVar1,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"let","");
    Intern(pSVar1,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"and","");
    Intern(pSVar1,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = g_the_interner;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"or","");
    Intern(pSVar1,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("g_the_interner == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/interner.h"
                ,0x4a,"static void SymbolInterner::Initialize()");
}

Assistant:

static void Initialize() {
    assert(g_the_interner == nullptr);
    g_the_interner = new SymbolInterner();
    g_the_interner->Intern("quote");
    g_the_interner->Intern("define");
    g_the_interner->Intern("set!");
    g_the_interner->Intern("lambda");
    g_the_interner->Intern("if");
    g_the_interner->Intern("begin");
    g_the_interner->Intern("unquote");
    g_the_interner->Intern("unquote-splicing");
    g_the_interner->Intern("quasiquote");
    g_the_interner->Intern("append");
    g_the_interner->Intern("defmacro");
    g_the_interner->Intern("let");
    g_the_interner->Intern("and");
    g_the_interner->Intern("or");
  }